

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

void __thiscall flatbuffers::FlatBufMethod::FlatBufMethod(FlatBufMethod *this,RPCCall *method)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  char *pcVar4;
  key_type local_40;
  
  (this->super_Method).super_CommentHolder._vptr_CommentHolder =
       (_func_int **)&PTR__CommentHolder_003f41e0;
  this->method_ = method;
  this->streaming_ = kNone;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"streaming","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(method->super_Definition).attributes,&local_40);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(method->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)(cVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (lVar3 != 0) {
    pcVar4 = (char *)(lVar3 + 0x20);
    iVar1 = std::__cxx11::string::compare(pcVar4);
    if (iVar1 == 0) {
      this->streaming_ = kClient;
    }
    iVar1 = std::__cxx11::string::compare(pcVar4);
    if (iVar1 == 0) {
      this->streaming_ = kServer;
    }
    iVar1 = std::__cxx11::string::compare(pcVar4);
    if (iVar1 == 0) {
      this->streaming_ = kBiDi;
    }
  }
  return;
}

Assistant:

FlatBufMethod(const RPCCall *method) : method_(method) {
    streaming_ = kNone;
    auto val = method_->attributes.Lookup("streaming");
    if (val) {
      if (val->constant == "client") streaming_ = kClient;
      if (val->constant == "server") streaming_ = kServer;
      if (val->constant == "bidi") streaming_ = kBiDi;
    }
  }